

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

HashUtil * __thiscall
cfd::core::HashUtil::operator<<
          (HashUtil *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  bool bVar1;
  ByteData local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  HashUtil *this_local;
  
  local_18 = bytes;
  bytes_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)bytes);
  if (!bVar1) {
    ByteData::ByteData(&local_30,local_18);
    ByteData::Push(&this->buffer_,&local_30);
    ByteData::~ByteData(&local_30);
  }
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const std::vector<uint8_t> &bytes) {
  if (!bytes.empty()) buffer_.Push(ByteData(bytes));
  return *this;
}